

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O1

void __thiscall MILBlob::Fp8E5M2::SetFloat(Fp8E5M2 *this,float f)

{
  undefined1 auVar1 [16];
  byte bVar2;
  undefined4 in_EAX;
  int iVar3;
  uint uVar4;
  range_error *this_00;
  undefined1 in_register_00001204 [12];
  FloatCast fp32;
  FloatCast local_14;
  
  auVar1._4_12_ = in_register_00001204;
  auVar1._0_4_ = f;
  iVar3 = movmskps(in_EAX,auVar1);
  bVar2 = (byte)(iVar3 << 7);
  (this->data).byte = bVar2;
  if (NAN(f)) {
    bVar2 = bVar2 | 0x7d;
  }
  else if (ABS(f) == INFINITY) {
    bVar2 = bVar2 | 0x7c;
  }
  else if ((f != 0.0) || (NAN(f))) {
    uVar4 = (uint)f >> 0x17 & 0xff;
    if (uVar4 < 0x8f) {
      if (0x6e < uVar4) {
        HandleFp32ToFp8ExponentMantissa<MILBlob::Fp8E5M2,MILBlob::Fp8E5M2::Cast>
                  (&this->data,&local_14);
        return;
      }
      this_00 = (range_error *)__cxa_allocate_exception(0x10);
      std::range_error::range_error(this_00,"Fp8E5M2 SetFloat exponent underflow.");
    }
    else {
      this_00 = (range_error *)__cxa_allocate_exception(0x10);
      std::range_error::range_error(this_00,"Fp8E5M2 SetFloat exponent overflow.");
    }
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  (this->data).byte = bVar2;
  return;
}

Assistant:

void Fp8E5M2::SetFloat(float f)
{
    FloatCast fp32 = {.f = f};
    data = {.byte = 0};
    // Set sign bit.
    data.components.sign = fp32.components.sign;

    // If f is nan or inf, set exponent to all 1's.
    if (std::isnan(f)) {
        data.components.exponent = (0x1 << fp8ExponentBits) - 1;
        data.components.mantissa = 1;
    } else if (std::isinf(f)) {
        data.components.exponent = (0x1 << fp8ExponentBits) - 1;
        data.components.mantissa = 0;
    } else if (f == 0) {
        data.components.exponent = 0;
        data.components.mantissa = 0;
    } else {
        int32_t unbiasedExponent = fp32.components.exponent - fp32ExponentBias;
        // Float is normal or denormal, check the exponent and set it.
        // For now, we throw on over/underflows. There are alternative ways to handle
        // this (round to zero).
        if (unbiasedExponent > fp8ExponentBias) {
            throw std::range_error("Fp8E5M2 SetFloat exponent overflow.");
        } else if (unbiasedExponent < (-1 * fp8ExponentBias - int32_t(fp8MantissaBits) + 1)) {
            throw std::range_error("Fp8E5M2 SetFloat exponent underflow.");
        }
        HandleFp32ToFp8ExponentMantissa<Fp8E5M2, Fp8E5M2::Cast>(data, fp32);
    }
}